

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::duplicateRows(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,bool *again)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *__x;
  uint *puVar1;
  int iVar2;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  undefined8 uVar4;
  DataKey *pDVar5;
  Real RVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale_00;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale_01;
  DataArray<int> perm_00;
  undefined1 auVar9 [16];
  DataArray<int> perm_01;
  DataArray<bool> isLhsEqualRhs_00;
  DataArray<bool> isLhsEqualRhs_01;
  shared_ptr<soplex::Tolerances> tols;
  shared_ptr<soplex::Tolerances> tols_00;
  type_conflict5 tVar10;
  bool bVar11;
  bool bVar12;
  int k_tmp;
  Verbosity VVar13;
  SPxOut *pSVar14;
  shared_ptr<soplex::Tolerances> *psVar15;
  ulong uVar16;
  pointer pDVar17;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  double *pdVar18;
  DuplicateRowsPS *pDVar19;
  long lVar20;
  long lVar21;
  ElementCompare *pEVar22;
  pointer pnVar23;
  uint n;
  long lVar24;
  int i;
  int iVar25;
  long lVar26;
  int iVar27;
  Item *pIVar28;
  ulong uVar29;
  ulong uVar30;
  int *piVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  undefined8 uVar35;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  Item *pIVar36;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *__x_00;
  int *perm;
  uint in_stack_fffffffffffff920;
  uint in_stack_fffffffffffff924;
  uint in_stack_fffffffffffff928;
  uint in_stack_fffffffffffff92c;
  uint in_stack_fffffffffffff930;
  uint uStack_6cc;
  uint local_6c8;
  undefined3 uStack_6c3;
  int local_6c0;
  bool local_6bc;
  fpclass_type local_6b8;
  int32_t iStack_6b4;
  int *perm_tmp;
  undefined1 local_698 [8];
  undefined8 uStack_690;
  uint local_688 [3];
  undefined3 uStack_67b;
  uint local_678;
  undefined3 uStack_673;
  int local_670;
  bool local_66c;
  undefined8 local_668;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  uint local_648 [5];
  undefined3 uStack_633;
  int local_630;
  bool local_62c;
  undefined8 local_628;
  int local_608;
  int local_604;
  int *idxMem;
  Result local_5e0;
  int remRows;
  undefined1 local_5d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5d0;
  uint local_5c8 [3];
  undefined3 uStack_5bb;
  uint local_5b8;
  undefined3 uStack_5b3;
  int local_5b0;
  bool local_5ac;
  undefined8 local_5a8;
  ElementCompare compare;
  IdxSet idxSet;
  Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  scale;
  DataArray<int> pClass;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  factor;
  Verbosity old_verbosity;
  uint uStack_494;
  uint auStack_490 [2];
  uint local_488 [2];
  uint auStack_480 [2];
  uint local_478 [2];
  int local_470;
  bool local_46c;
  fpclass_type local_468;
  int32_t iStack_464;
  DataArray<int> classSize;
  undefined1 local_420 [56];
  DataArray<bool> isLhsEqualRhs;
  DataArray<bool> remRow;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newRhsVec;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  newLhsVec;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_388;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_378;
  undefined1 local_368 [48];
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_338;
  undefined1 local_320 [48];
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_2f0;
  int *local_2d8;
  uint auStack_2d0 [2];
  uint local_2c8 [2];
  uint auStack_2c0 [2];
  uint local_2b8 [2];
  int local_2b0;
  bool local_2ac;
  undefined8 local_2a8;
  Tolerances *local_298;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_290;
  uint local_288 [2];
  uint auStack_280 [2];
  uint local_278 [2];
  int local_270;
  bool local_26c;
  fpclass_type local_268;
  int32_t iStack_264;
  Tolerances *local_258;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_250;
  uint local_248 [2];
  uint auStack_240 [2];
  uint local_238 [2];
  int local_230;
  bool local_22c;
  fpclass_type local_228;
  int32_t iStack_224;
  int *local_218;
  uint auStack_210 [2];
  uint local_208 [2];
  uint auStack_200 [2];
  uint local_1f8 [2];
  int local_1f0;
  bool local_1ec;
  undefined8 local_1e8;
  Tolerances *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  uint local_1c8 [2];
  uint auStack_1c0 [2];
  uint local_1b8 [2];
  int local_1b0;
  bool local_1ac;
  fpclass_type local_1a8;
  int32_t iStack_1a4;
  int *local_198;
  uint auStack_190 [2];
  uint local_188 [2];
  uint auStack_180 [2];
  uint local_178 [2];
  int local_170;
  bool local_16c;
  undefined8 local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  remRows = 0;
  iVar2 = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
  local_5e0 = removeEmpty(this,lp);
  if (local_5e0 == OKAY) {
    VVar13 = ERROR;
    iVar25 = 0;
    while( true ) {
      old_verbosity = VVar13;
      iVar27 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      if (iVar27 <= (int)VVar13) break;
      pIVar28 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      iVar27 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[(int)VVar13].idx;
      if (pIVar28[iVar27].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 1) {
        removeRowSingleton(this,lp,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)(pIVar28 + iVar27),(int *)&old_verbosity);
        iVar25 = iVar25 + 1;
        VVar13 = old_verbosity;
      }
      VVar13 = VVar13 + WARNING;
    }
    this_01 = this;
    if (((0 < iVar25) &&
        (pSVar14 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout, pSVar14 != (SPxOut *)0x0)) && (3 < (int)pSVar14->m_verbosity)) {
      old_verbosity = pSVar14->m_verbosity;
      compare.epsiloncompare.m_backend.data._M_elems[0] = 4;
      (*pSVar14->_vptr_SPxOut[2])();
      this_01 = this;
      pSVar14 = soplex::operator<<((this->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout,
                                   "Simplifier duplicate rows (row singleton stage) removed ");
      pSVar14 = soplex::operator<<(pSVar14,iVar25);
      pSVar14 = soplex::operator<<(pSVar14," rows, ");
      pSVar14 = soplex::operator<<(pSVar14,iVar25);
      pSVar14 = soplex::operator<<(pSVar14," non-zeros");
      std::endl<char,std::char_traits<char>>(pSVar14->m_streams[pSVar14->m_verbosity]);
      pSVar14 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar14->_vptr_SPxOut[2])(pSVar14,&old_verbosity);
      iVar27 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
    }
    local_5e0 = OKAY;
    if (1 < iVar27) {
      DataArray<int>::DataArray(&pClass,iVar27,0,1.2);
      DataArray<int>::DataArray
                (&classSize,
                 (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum,0,1.2);
      Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Array(&scale,(lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
      idxMem = (int *)0x0;
      spx_alloc<int*>(&idxMem,(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum);
      idxSet.len = (lp->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
      idxSet._vptr_IdxSet = (_func_int **)&PTR__IdxSet_0053d170;
      idxSet.num = 0;
      idxSet.idx = idxMem;
      idxSet.freeArray = false;
      *pClass.data = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)
                 scale.data.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0.0);
      iVar25 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      *classSize.data = iVar25;
      lVar33 = 0x38;
      for (lVar26 = 1; lVar26 < iVar25; lVar26 = lVar26 + 1) {
        pClass.data[lVar26] = 0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((long)((scale.data.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar33),0.0);
        classSize.data[lVar26] = 0;
        lVar20 = (long)idxSet.num;
        idxSet.num = idxSet.num + 1;
        idxSet.idx[lVar20] = (int)lVar26;
        iVar25 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
        lVar33 = lVar33 + 0x38;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
      psVar15 = &(this_01->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances;
      local_5e0 = INFEASIBLE;
      for (lVar26 = 0;
          lVar26 < (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum; lVar26 = lVar26 + 1) {
        pIVar28 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[lVar26].idx;
        lVar20 = 0;
        for (lVar33 = 0;
            uVar16 = (ulong)(pIVar28->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused, lVar33 < (long)uVar16; lVar33 = lVar33 + 1) {
          pNVar3 = (pIVar28->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          uVar4 = *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar20 + 0x20);
          compare.epsiloncompare.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
          compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_ =
               (undefined3)((ulong)uVar4 >> 0x28);
          puVar1 = (uint *)((long)(pNVar3->val).m_backend.data._M_elems + lVar20);
          compare.epsiloncompare.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          compare.epsiloncompare.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)(pNVar3->val).m_backend.data._M_elems + lVar20 + 0x10);
          compare.epsiloncompare.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          uVar4 = *(undefined8 *)(puVar1 + 2);
          compare.epsiloncompare.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
          compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_ =
               (undefined3)((ulong)uVar4 >> 0x28);
          compare.epsiloncompare.m_backend.exp =
               *(int *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar20);
          compare.epsiloncompare.m_backend.neg =
               *(bool *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar20 + 4);
          compare.epsiloncompare.m_backend._48_8_ =
               *(undefined8 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar20 + 8);
          iVar25 = *(int *)((long)(&((pIVar28->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val + 1) + lVar20);
          local_5d8 = (undefined1  [8])0x0;
          tVar10 = boost::multiprecision::operator==
                             (scale.data.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + iVar25,(double *)local_5d8
                             );
          if (tVar10) {
            *(ulong *)(scale.data.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems + 8
                      ) = CONCAT35(compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_,
                                   compare.epsiloncompare.m_backend.data._M_elems._32_5_);
            puVar1 = scale.data.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = compare.epsiloncompare.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT35(compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_,
                          compare.epsiloncompare.m_backend.data._M_elems._24_5_);
            *(undefined8 *)
             scale.data.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems =
                 compare.epsiloncompare.m_backend.data._M_elems._0_8_;
            *(undefined8 *)
             (scale.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems + 2) =
                 compare.epsiloncompare.m_backend.data._M_elems._8_8_;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.exp =
                 compare.epsiloncompare.m_backend.exp;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.neg =
                 compare.epsiloncompare.m_backend.neg;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.fpclass =
                 compare.epsiloncompare.m_backend.fpclass;
            scale.data.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.prec_elem =
                 compare.epsiloncompare.m_backend.prec_elem;
          }
          iVar27 = pClass.data[iVar25];
          pDVar17 = (this_01->m_classSetRows).data.
                    super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_5a8._0_4_ = cpp_dec_float_finite;
          local_5a8._4_4_ = 10;
          local_5d8 = (undefined1  [8])0x0;
          _Stack_5d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_5c8[0] = 0;
          local_5c8[1] = 0;
          stack0xfffffffffffffa40 = 0;
          uStack_5bb = 0;
          _local_5b8 = 0;
          uStack_5b3 = 0;
          local_5b0 = 0;
          local_5ac = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    ((cpp_dec_float<50U,_int,_void> *)local_5d8,
                     (cpp_dec_float<50U,_int,_void> *)&compare,
                     &scale.data.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend);
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(pDVar17 + iVar27,iVar25,
                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_5d8);
          piVar31 = classSize.data + pClass.data[iVar25];
          *piVar31 = *piVar31 + -1;
          if (*piVar31 == 0) {
            lVar24 = (long)idxSet.num;
            idxSet.num = idxSet.num + 1;
            idxSet.idx[lVar24] = pClass.data[iVar25];
          }
          lVar20 = lVar20 + 0x3c;
        }
        lVar33 = 0;
        pIVar36 = pIVar28;
        while( true ) {
          if ((int)uVar16 <= lVar33) break;
          iVar25 = pClass.data
                   [(pIVar28->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem[lVar33].idx];
          if (0 < (this_01->m_classSetRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar25].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_5d8,
                       &psVar15->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
            ;
            RVar6 = Tolerances::epsilon((Tolerances *)local_5d8);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_d8,RVar6,(type *)0x0);
            ElementCompare::ElementCompare
                      (&compare,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_d8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_5d0);
            pDVar17 = (this_01->m_classSetRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar27 = pDVar17[iVar25].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            pIVar28 = pIVar36;
            if (1 < iVar27) {
              SPxQuicksort<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>,soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::ElementCompare>
                        (pDVar17[iVar25].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem,iVar27,&compare,0,true);
              pDVar17 = (this_01->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pIVar28 = pIVar36;
            }
            iVar27 = *idxSet.idx;
            lVar20 = (long)idxSet.num;
            idxSet.num = idxSet.num + -1;
            *idxSet.idx = idxSet.idx[lVar20 + -1];
            lVar24 = 0;
            lVar20 = 0;
            while( true ) {
              if (pDVar17[iVar25].
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused <= lVar20) break;
              if (lVar24 != 0) {
                pNVar3 = pDVar17[iVar25].
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem;
                local_118.m_backend.data._M_elems._32_8_ =
                     *(undefined8 *)((long)(pNVar3->val).m_backend.data._M_elems + lVar24 + 0x20);
                puVar1 = (uint *)((long)(pNVar3->val).m_backend.data._M_elems + lVar24);
                local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
                local_118.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
                puVar1 = (uint *)((long)(pNVar3->val).m_backend.data._M_elems + lVar24 + 0x10);
                local_118.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
                local_118.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
                local_118.m_backend.exp =
                     *(int *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar24);
                local_118.m_backend.neg =
                     *(bool *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar24 + 4U);
                local_118.m_backend._48_8_ =
                     *(undefined8 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar24 + 8U);
                local_158.m_backend.data._M_elems[0] = old_verbosity;
                local_158.m_backend.data._M_elems[1] = uStack_494;
                local_158.m_backend.data._M_elems[2] = auStack_490[0];
                local_158.m_backend.data._M_elems[3] = auStack_490[1];
                local_158.m_backend.data._M_elems[4] = local_488[0];
                local_158.m_backend.data._M_elems[5] = local_488[1];
                local_158.m_backend.data._M_elems[6] = auStack_480[0];
                local_158.m_backend.data._M_elems[7] = auStack_480[1];
                local_158.m_backend.data._M_elems[8] = local_478[0];
                local_158.m_backend.data._M_elems[9] = local_478[1];
                local_158.m_backend.exp = local_470;
                local_158.m_backend.neg = local_46c;
                local_158.m_backend.fpclass = local_468;
                local_158.m_backend.prec_elem = iStack_464;
                epsZero(&local_68,this_01);
                bVar11 = NErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                   (&local_118,&local_158,&local_68);
                if (bVar11) {
                  iVar27 = *idxSet.idx;
                  lVar21 = (long)idxSet.num;
                  idxSet.num = idxSet.num + -1;
                  *idxSet.idx = idxSet.idx[lVar21 + -1];
                }
              }
              pDVar17 = (this_01->m_classSetRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pNVar3 = pDVar17[iVar25].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pClass.data[*(int *)((long)(&pNVar3->val + 1) + lVar24)] = iVar27;
              classSize.data[iVar27] = classSize.data[iVar27] + 1;
              local_478 = *(uint (*) [2])
                           ((long)(pNVar3->val).m_backend.data._M_elems + lVar24 + 0x20);
              puVar1 = (uint *)((long)(pNVar3->val).m_backend.data._M_elems + lVar24);
              _old_verbosity = *(undefined8 *)puVar1;
              auStack_490 = *(uint (*) [2])(puVar1 + 2);
              puVar1 = (uint *)((long)(pNVar3->val).m_backend.data._M_elems + lVar24 + 0x10);
              local_488 = *(uint (*) [2])puVar1;
              auStack_480 = *(uint (*) [2])(puVar1 + 2);
              local_470 = *(int *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar24);
              local_46c = *(bool *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar24 + 4U);
              _local_468 = *(undefined8 *)((long)(&(pNVar3->val).m_backend.data + 1) + lVar24 + 8U);
              lVar20 = lVar20 + 1;
              lVar24 = lVar24 + 0x3c;
            }
            pDVar17[iVar25].
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused = 0;
            uVar16 = (ulong)(uint)(pIVar28->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .memused;
            pIVar36 = pIVar28;
          }
          lVar33 = lVar33 + 1;
        }
      }
      free(idxMem);
      idxMem = (int *)0x0;
      lVar26 = 0;
      DataArray<bool>::DataArray
                (&remRow,(lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum,0,1.2);
      n = (lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum;
      pDVar17 = (this_01->m_dupRows).data.
                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar16 = 0;
      if (0 < (int)n) {
        uVar16 = (ulong)n;
      }
      for (; uVar16 * 0x20 != lVar26; lVar26 = lVar26 + 0x20) {
        *(undefined4 *)
         ((long)&(pDVar17->
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).memused + lVar26) = 0;
      }
      for (lVar26 = 0; lVar26 < (int)n; lVar26 = lVar26 + 1) {
        remRow.data[lVar26] = false;
        iVar25 = pClass.data[lVar26];
        pDVar17 = (this_01->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&compare,0.0,(type *)0x0);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(pDVar17 + iVar25,(int)lVar26,
              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&compare);
        n = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
      }
      perm_tmp = (int *)0x0;
      spx_alloc<int*>(&perm_tmp,n);
      uVar16 = 0;
      uVar34 = 0;
      if (0 < (int)n) {
        uVar34 = (ulong)n;
      }
      for (; uVar34 != uVar16; uVar16 = uVar16 + 1) {
        perm_tmp[uVar16] = 0;
      }
      pDVar17 = (this_01->m_dupRows).data.
                super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar28 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      pDVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey;
      uVar16 = 0xffffffffffffffff;
      uVar30 = 0xffffffff;
      for (uVar29 = 0;
          (long)uVar29 <
          (long)(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum; uVar29 = uVar29 + 1) {
        iVar25 = pDVar17[uVar29].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        if (1 < iVar25) {
          pNVar3 = pDVar17[uVar29].
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          if (pIVar28[pDVar5[pNVar3->idx].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused != 1) {
            piVar31 = &pNVar3[1].idx;
            for (lVar26 = 1; lVar26 < iVar25; lVar26 = lVar26 + 1) {
              perm_tmp[*piVar31] = -1;
              iVar25 = pDVar17[uVar29].
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
              piVar31 = piVar31 + 0xf;
            }
            if ((int)uVar16 < 0) {
              uVar16 = uVar29;
            }
            uVar16 = uVar16 & 0xffffffff;
            uVar30 = uVar29 & 0xffffffff;
          }
        }
      }
      iVar25 = 0;
      for (uVar29 = 0; uVar34 != uVar29; uVar29 = uVar29 + 1) {
        if (-1 < perm_tmp[uVar29]) {
          perm_tmp[uVar29] = iVar25;
          iVar25 = iVar25 + 1;
        }
      }
      __x = &(lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector(&newLhsVec.val,&__x->val);
      __x_00 = &(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).right;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector(&newRhsVec.val,&__x_00->val);
      this_00 = &this_01->m_hist;
      bVar11 = false;
      for (uVar29 = 0;
          uVar32 = (ulong)(lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum, (long)uVar29 < (long)uVar32; uVar29 = uVar29 + 1) {
        pDVar17 = (this_01->m_dupRows).data.
                  super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar25 = pDVar17[uVar29].
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        if ((1 < iVar25) &&
           ((lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem
            [(lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey
             [(pDVar17[uVar29].
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem)->idx].idx].data.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused != 1)) {
          piVar31 = (this_01->m_stat).data;
          piVar31[0xc] = iVar25 + piVar31[0xc] + -1;
          pdVar18 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&compare,-*pdVar18,(type *)0x0);
          pdVar18 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&perm,*pdVar18,(type *)0x0);
          _local_5b8 = _local_6c8;
          uStack_5b3 = uStack_6c3;
          _Stack_5d0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920);
          local_5c8[1] = in_stack_fffffffffffff92c;
          local_5c8[0] = in_stack_fffffffffffff928;
          stack0xfffffffffffffa40 = (undefined5)CONCAT44(uStack_6cc,in_stack_fffffffffffff930);
          uStack_5bb = (undefined3)(uStack_6cc >> 8);
          local_5d8 = (undefined1  [8])perm;
          local_5b0 = local_6c0;
          local_5ac = local_6bc;
          local_5a8._0_4_ = local_6b8;
          local_5a8._4_4_ = iStack_6b4;
          DataArray<bool>::DataArray
                    (&isLhsEqualRhs,
                     (this_01->m_dupRows).data.
                     super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar29].
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused,0,1.2);
          lVar26 = 0x38;
          lVar33 = 0;
          local_608 = -1;
          iVar25 = -1;
          local_604 = local_608;
          while( true ) {
            pDVar17 = (this_01->m_dupRows).data.
                      super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (pDVar17[uVar29].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused <= lVar33) break;
            iVar27 = *(int *)((long)((pDVar17[uVar29].
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem)->val).m_backend.data._M_elems + lVar26);
            bVar12 = boost::multiprecision::operator==
                               ((__x->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar27,
                                (__x_00->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar27);
            isLhsEqualRhs.data[lVar33] = bVar12;
            if (iVar25 == -1) {
              pnVar23 = (__x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar4 = *(undefined8 *)(pnVar23[iVar27].m_backend.data._M_elems + 8);
              compare.epsiloncompare.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
              compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_ =
                   (undefined3)((ulong)uVar4 >> 0x28);
              compare.epsiloncompare.m_backend.data._M_elems._0_8_ =
                   *(undefined8 *)&pnVar23[iVar27].m_backend.data;
              compare.epsiloncompare.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(pnVar23[iVar27].m_backend.data._M_elems + 2);
              puVar1 = pnVar23[iVar27].m_backend.data._M_elems + 4;
              compare.epsiloncompare.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
              uVar4 = *(undefined8 *)(puVar1 + 2);
              compare.epsiloncompare.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
              compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_ =
                   (undefined3)((ulong)uVar4 >> 0x28);
              compare.epsiloncompare.m_backend.exp = pnVar23[iVar27].m_backend.exp;
              compare.epsiloncompare.m_backend.neg = pnVar23[iVar27].m_backend.neg;
              compare.epsiloncompare.m_backend.fpclass = pnVar23[iVar27].m_backend.fpclass;
              compare.epsiloncompare.m_backend.prec_elem = pnVar23[iVar27].m_backend.prec_elem;
              pnVar23 = (__x_00->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar4 = *(undefined8 *)(pnVar23[iVar27].m_backend.data._M_elems + 8);
              _local_5b8 = (undefined5)uVar4;
              uStack_5b3 = (undefined3)((ulong)uVar4 >> 0x28);
              local_5d8 = *(undefined1 (*) [8])&pnVar23[iVar27].m_backend.data;
              _Stack_5d0._M_pi =
                   *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    (pnVar23[iVar27].m_backend.data._M_elems + 2);
              puVar1 = pnVar23[iVar27].m_backend.data._M_elems + 4;
              local_5c8._0_8_ = *(undefined8 *)puVar1;
              uVar4 = *(undefined8 *)(puVar1 + 2);
              stack0xfffffffffffffa40 = (undefined5)uVar4;
              uStack_5bb = (undefined3)((ulong)uVar4 >> 0x28);
              local_5b0 = pnVar23[iVar27].m_backend.exp;
              local_5ac = pnVar23[iVar27].m_backend.neg;
              local_5a8._0_4_ = pnVar23[iVar27].m_backend.fpclass;
              local_5a8._4_4_ = pnVar23[iVar27].m_backend.prec_elem;
              iVar25 = iVar27;
            }
            else {
              perm = (int *)0x0;
              local_668._0_4_ = cpp_dec_float_finite;
              local_668._4_4_ = 10;
              local_698._0_4_ = 0;
              local_698._4_4_ = 0;
              uStack_690._0_4_ = 0;
              uStack_690._4_4_ = 0;
              local_688[0] = 0;
              local_688[1] = 0;
              stack0xfffffffffffff980 = 0;
              uStack_67b = 0;
              _local_678 = 0;
              uStack_673 = 0;
              local_670 = 0;
              local_66c = false;
              factor.m_backend.fpclass = cpp_dec_float_finite;
              factor.m_backend.prec_elem = 10;
              factor.m_backend.data._M_elems[0] = 0;
              factor.m_backend.data._M_elems[1] = 0;
              factor.m_backend.data._M_elems[2] = 0;
              factor.m_backend.data._M_elems[3] = 0;
              factor.m_backend.data._M_elems[4] = 0;
              factor.m_backend.data._M_elems[5] = 0;
              factor.m_backend.data._M_elems._24_5_ = 0;
              factor.m_backend.data._M_elems[7]._1_3_ = 0;
              factor.m_backend.data._M_elems._32_5_ = 0;
              factor.m_backend._37_8_ = 0;
              boost::multiprecision::default_ops::
              eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&factor.m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend,
                         &scale.data.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend);
              ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)
                        ((ulong)ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr & 0xffffffff00000000);
              tVar10 = boost::multiprecision::operator>(&factor,(int *)&ptr);
              if (tVar10) {
                pnVar23 = (__x->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pdVar18 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)local_420,-*pdVar18,(type *)0x0);
                tVar10 = boost::multiprecision::operator<=
                                   (pnVar23 + iVar27,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)local_420);
                if (tVar10) {
                  pdVar18 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>((cpp_dec_float<50U,_int,_void> *)&ptr,-*pdVar18,(type *)0x0)
                  ;
                }
                else {
                  local_628._0_4_ = cpp_dec_float_finite;
                  local_628._4_4_ = 10;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_648[0] = 0;
                  local_648[1] = 0;
                  local_648[2] = 0;
                  local_648[3] = 0;
                  stack0xfffffffffffff9c8 = 0;
                  uStack_633 = 0;
                  local_630 = 0;
                  local_62c = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)&ptr,
                             &(__x->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend,
                             &factor.m_backend);
                }
                _local_6c8 = stack0xfffffffffffff9c8;
                uStack_6c3 = uStack_633;
                uStack_6cc = local_648[3];
                perm = (int *)ptr.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                local_6c0 = local_630;
                local_6bc = local_62c;
                local_6b8 = (fpclass_type)local_628;
                iStack_6b4 = local_628._4_4_;
                pnVar23 = (__x_00->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                in_stack_fffffffffffff920 =
                     (uint)ptr.
                           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                in_stack_fffffffffffff924 =
                     ptr.
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi._4_4_;
                in_stack_fffffffffffff928 = local_648[0];
                in_stack_fffffffffffff92c = local_648[1];
                in_stack_fffffffffffff930 = local_648[2];
                pdVar18 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)local_420,*pdVar18,(type *)0x0);
                tVar10 = boost::multiprecision::operator>=
                                   (pnVar23 + iVar27,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)local_420);
                if (tVar10) {
                  pdVar18 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>((cpp_dec_float<50U,_int,_void> *)&ptr,*pdVar18,(type *)0x0);
                }
                else {
                  local_628._0_4_ = cpp_dec_float_finite;
                  local_628._4_4_ = 10;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_648[0] = 0;
                  local_648[1] = 0;
                  local_648[2] = 0;
                  local_648[3] = 0;
                  stack0xfffffffffffff9c8 = 0;
                  uStack_633 = 0;
                  local_630 = 0;
                  local_62c = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)&ptr,
                             &(__x_00->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend,
                             &factor.m_backend);
                }
              }
              else {
                pnVar23 = (__x_00->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pdVar18 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)local_420,*pdVar18,(type *)0x0);
                tVar10 = boost::multiprecision::operator>=
                                   (pnVar23 + iVar27,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)local_420);
                if (tVar10) {
                  pdVar18 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>((cpp_dec_float<50U,_int,_void> *)&ptr,-*pdVar18,(type *)0x0)
                  ;
                }
                else {
                  local_628._0_4_ = cpp_dec_float_finite;
                  local_628._4_4_ = 10;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_648[0] = 0;
                  local_648[1] = 0;
                  local_648[2] = 0;
                  local_648[3] = 0;
                  stack0xfffffffffffff9c8 = 0;
                  uStack_633 = 0;
                  local_630 = 0;
                  local_62c = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)&ptr,
                             &(__x_00->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend,
                             &factor.m_backend);
                }
                _local_6c8 = stack0xfffffffffffff9c8;
                uStack_6c3 = uStack_633;
                uStack_6cc = local_648[3];
                perm = (int *)ptr.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                local_6c0 = local_630;
                local_6bc = local_62c;
                local_6b8 = (fpclass_type)local_628;
                iStack_6b4 = local_628._4_4_;
                pnVar23 = (__x->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                in_stack_fffffffffffff920 =
                     (uint)ptr.
                           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                in_stack_fffffffffffff924 =
                     ptr.
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi._4_4_;
                in_stack_fffffffffffff928 = local_648[0];
                in_stack_fffffffffffff92c = local_648[1];
                in_stack_fffffffffffff930 = local_648[2];
                pdVar18 = (double *)infinity();
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<double>
                          ((cpp_dec_float<50U,_int,_void> *)local_420,-*pdVar18,(type *)0x0);
                tVar10 = boost::multiprecision::operator<=
                                   (pnVar23 + iVar27,
                                    (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)local_420);
                if (tVar10) {
                  pdVar18 = (double *)infinity();
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<double>((cpp_dec_float<50U,_int,_void> *)&ptr,*pdVar18,(type *)0x0);
                }
                else {
                  local_628._0_4_ = cpp_dec_float_finite;
                  local_628._4_4_ = 10;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  ptr.
                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_648[0] = 0;
                  local_648[1] = 0;
                  local_648[2] = 0;
                  local_648[3] = 0;
                  stack0xfffffffffffff9c8 = 0;
                  uStack_633 = 0;
                  local_630 = 0;
                  local_62c = false;
                  boost::multiprecision::default_ops::
                  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            ((cpp_dec_float<50U,_int,_void> *)&ptr,
                             &(__x->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend,
                             &factor.m_backend);
                }
              }
              _local_678 = stack0xfffffffffffff9c8;
              uStack_673 = uStack_633;
              local_688[0] = local_648[0];
              local_688[1] = local_648[1];
              stack0xfffffffffffff980 = (undefined5)CONCAT44(local_648[3],local_648[2]);
              uStack_67b = (undefined3)(local_648[3] >> 8);
              local_698 = (undefined1  [8])
                          ptr.
                          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr;
              uStack_690 = ptr.
                           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
              local_670 = local_630;
              local_66c = local_62c;
              local_668._0_4_ = (fpclass_type)local_628;
              local_668._4_4_ = local_628._4_4_;
              tVar10 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&perm,&compare.epsiloncompare);
              if (tVar10) {
                compare.epsiloncompare.m_backend.data._M_elems._32_5_ = _local_6c8;
                compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_ = uStack_6c3;
                compare.epsiloncompare.m_backend.data._M_elems[3] = in_stack_fffffffffffff924;
                compare.epsiloncompare.m_backend.data._M_elems[2] = in_stack_fffffffffffff920;
                compare.epsiloncompare.m_backend.data._M_elems[5] = in_stack_fffffffffffff92c;
                compare.epsiloncompare.m_backend.data._M_elems[4] = in_stack_fffffffffffff928;
                compare.epsiloncompare.m_backend.data._M_elems._24_5_ =
                     SUB85(CONCAT44(uStack_6cc,in_stack_fffffffffffff930),0);
                compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_ =
                     (undefined3)(uStack_6cc >> 8);
                compare.epsiloncompare.m_backend.data._M_elems._0_8_ = perm;
                compare.epsiloncompare.m_backend.exp = local_6c0;
                compare.epsiloncompare.m_backend.neg = local_6bc;
                compare.epsiloncompare.m_backend.fpclass = local_6b8;
                compare.epsiloncompare.m_backend.prec_elem = iStack_6b4;
                local_604 = iVar27;
              }
              tVar10 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_698,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_5d8);
              if (tVar10) {
                _local_5b8 = _local_678;
                uStack_5b3 = uStack_673;
                local_5c8[0] = local_688[0];
                local_5c8[1] = local_688[1];
                stack0xfffffffffffffa40 = stack0xfffffffffffff980;
                uStack_5bb = uStack_67b;
                local_5d8 = local_698;
                _Stack_5d0._M_pi = uStack_690;
                local_5b0 = local_670;
                local_5ac = local_66c;
                local_5a8._0_4_ = (fpclass_type)local_668;
                local_5a8._4_4_ = local_668._4_4_;
                local_608 = iVar27;
              }
              remRow.data[iVar27] = true;
            }
            lVar33 = lVar33 + 1;
            lVar26 = lVar26 + 0x3c;
          }
          if (iVar25 == -1) {
            bVar12 = true;
          }
          else {
            tVar10 = boost::multiprecision::operator>
                               (&compare.epsiloncompare,
                                (__x->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar25);
            pEVar22 = (ElementCompare *)
                      ((__x->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar25);
            if (tVar10) {
              pEVar22 = &compare;
            }
            uVar4 = *(undefined8 *)((pEVar22->epsiloncompare).m_backend.data._M_elems + 8);
            _local_6c8 = (undefined5)uVar4;
            uStack_6c3 = SUB83(uVar4,5);
            perm = *(int **)(pEVar22->epsiloncompare).m_backend.data._M_elems;
            uVar35 = *(undefined8 *)((pEVar22->epsiloncompare).m_backend.data._M_elems + 2);
            uVar7 = *(undefined8 *)((pEVar22->epsiloncompare).m_backend.data._M_elems + 4);
            uVar8 = *(undefined8 *)((pEVar22->epsiloncompare).m_backend.data._M_elems + 6);
            in_stack_fffffffffffff928 = (uint)uVar7;
            in_stack_fffffffffffff92c = (uint)((ulong)uVar7 >> 0x20);
            in_stack_fffffffffffff930 = (uint)uVar8;
            uStack_6cc = (uint)((ulong)uVar8 >> 0x20);
            in_stack_fffffffffffff920 = (uint)uVar35;
            in_stack_fffffffffffff924 = (uint)((ulong)uVar35 >> 0x20);
            local_6c0 = *(int *)(&(pEVar22->epsiloncompare).m_backend.data + 1);
            local_6bc = *(bool *)((long)(&(pEVar22->epsiloncompare).m_backend.data + 1) + 4);
            _local_6b8 = *(undefined8 *)((long)(&(pEVar22->epsiloncompare).m_backend.data + 1) + 8);
            tVar10 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_5d8,
                                (__x_00->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar25);
            pnVar23 = (__x_00->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + iVar25;
            if (tVar10) {
              pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)local_5d8;
            }
            uVar35 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 8);
            _local_678 = (undefined5)uVar35;
            uStack_673 = (undefined3)((ulong)uVar35 >> 0x28);
            local_698 = *(undefined1 (*) [8])(pnVar23->m_backend).data._M_elems;
            uStack_690 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                          ((pnVar23->m_backend).data._M_elems + 2);
            local_688._0_8_ = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 4);
            uVar35 = *(undefined8 *)((pnVar23->m_backend).data._M_elems + 6);
            stack0xfffffffffffff980 = (undefined5)uVar35;
            uStack_67b = (undefined3)((ulong)uVar35 >> 0x28);
            local_670 = (pnVar23->m_backend).exp;
            local_66c = (pnVar23->m_backend).neg;
            local_668._0_4_ = (pnVar23->m_backend).fpclass;
            local_668._4_4_ = (pnVar23->m_backend).prec_elem;
            if (uVar29 == uVar30) {
              DataArray<int>::DataArray((DataArray<int> *)&factor,n,0,1.2);
              for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
                *(int *)(factor.m_backend.data._M_elems._8_8_ + uVar32 * 4) = perm_tmp[uVar32];
              }
              pDVar19 = (DuplicateRowsPS *)operator_new(0x100);
              pDVar17 = (this_01->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)&local_2f0,&scale);
              DataArray<int>::DataArray
                        ((DataArray<int> *)(local_320 + 0x18),(DataArray<int> *)&factor);
              DataArray<bool>::DataArray((DataArray<bool> *)local_320,&isLhsEqualRhs);
              auStack_190[1] = in_stack_fffffffffffff924;
              auStack_190[0] = in_stack_fffffffffffff920;
              local_188[1] = in_stack_fffffffffffff92c;
              local_188[0] = in_stack_fffffffffffff928;
              auStack_180[1] = uStack_6cc;
              auStack_180[0] = in_stack_fffffffffffff930;
              local_198 = perm;
              auStack_1c0[1]._1_3_ = uStack_67b;
              auStack_1c0._0_5_ = stack0xfffffffffffff980;
              local_1d8 = (Tolerances *)local_698;
              p_Stack_1d0 = uStack_690;
              local_1c8[0] = local_688[0];
              local_1c8[1] = local_688[1];
              local_1b8[1]._1_3_ = uStack_673;
              local_1b8._0_5_ = _local_678;
              local_1b0 = local_670;
              local_1ac = local_66c;
              local_1a8 = (fpclass_type)local_668;
              iStack_1a4 = local_668._4_4_;
              local_178 = (uint  [2])uVar4;
              local_170 = local_6c0;
              local_16c = local_6bc;
              local_168 = _local_6b8;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_420,
                         &psVar15->
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
              RVar6 = Tolerances::epsilon((Tolerances *)local_420._0_8_);
              bVar12 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_198,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_1d8,RVar6);
              isLhsEqualRhs_01._1_7_ = 0;
              isLhsEqualRhs_01.thesize._0_1_ = (int)uVar30 == (int)uVar16;
              uVar35 = 0x26935b;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_378,
                         &psVar15->
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
              scale_01.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_320 + 0x18);
              scale_01.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_2f0;
              scale_01.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_320;
              perm_01.data._0_1_ = bVar12;
              perm_01.thesize = 1;
              perm_01.themax = 0;
              perm_01.data._1_7_ = 0;
              perm_01.memFactor = (Real)&local_378;
              isLhsEqualRhs_01.data = (bool *)uVar35;
              isLhsEqualRhs_01.memFactor = (Real)this_01;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
              _4_4_ = in_stack_fffffffffffff924;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
              _0_4_ = in_stack_fffffffffffff920;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi._0_4_ = in_stack_fffffffffffff928;
              tols_00.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi._4_4_ = in_stack_fffffffffffff92c;
              DuplicateRowsPS::DuplicateRowsPS
                        (pDVar19,lp,iVar25,local_604,local_608,pDVar17 + uVar30,scale_01,perm_01,
                         isLhsEqualRhs_01,SUB81(__x_00,0),perm._0_1_,tols_00,
                         SUB41(in_stack_fffffffffffff930,0));
              std::
              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              ::
              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS,void>
                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          *)&ptr,pDVar19);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_378._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_420 + 8));
              DataArray<bool>::~DataArray((DataArray<bool> *)local_320);
              DataArray<int>::~DataArray((DataArray<int> *)(local_320 + 0x18));
              std::
              _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::~_Vector_base(&local_2f0);
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&this_00->data,(value_type *)&ptr);
            }
            else {
              DataArray<int>::DataArray((DataArray<int> *)&factor,0,0,1.2);
              pDVar19 = (DuplicateRowsPS *)operator_new(0x100);
              pDVar17 = (this_01->m_dupRows).data.
                        super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::Array((Array<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)&local_338,&scale);
              DataArray<int>::DataArray
                        ((DataArray<int> *)(local_368 + 0x18),(DataArray<int> *)&factor);
              DataArray<bool>::DataArray((DataArray<bool> *)local_368,&isLhsEqualRhs);
              auStack_210[1] = in_stack_fffffffffffff924;
              auStack_210[0] = in_stack_fffffffffffff920;
              local_208[1] = in_stack_fffffffffffff92c;
              local_208[0] = in_stack_fffffffffffff928;
              auStack_200[1] = uStack_6cc;
              auStack_200[0] = in_stack_fffffffffffff930;
              local_218 = perm;
              auStack_240[1]._1_3_ = uStack_67b;
              auStack_240._0_5_ = stack0xfffffffffffff980;
              local_258 = (Tolerances *)local_698;
              p_Stack_250 = uStack_690;
              local_248[0] = local_688[0];
              local_248[1] = local_688[1];
              local_238[1]._1_3_ = uStack_673;
              local_238._0_5_ = _local_678;
              local_230 = local_670;
              local_22c = local_66c;
              local_228 = (fpclass_type)local_668;
              iStack_224 = local_668._4_4_;
              local_1f8 = (uint  [2])uVar4;
              local_1f0 = local_6c0;
              local_1ec = local_6bc;
              local_1e8 = _local_6b8;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_420,
                         &psVar15->
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
              RVar6 = Tolerances::epsilon((Tolerances *)local_420._0_8_);
              bVar12 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_218,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_258,RVar6);
              uVar35 = 0x269108;
              std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                        (&local_388,
                         &psVar15->
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
              isLhsEqualRhs_00._1_7_ = 0;
              isLhsEqualRhs_00.thesize._0_1_ = uVar29 == (uVar16 & 0xffffffff);
              scale_00.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)(local_368 + 0x18);
              scale_00.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_338;
              scale_00.data.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_368;
              auVar9 = ZEXT116(bVar12) << 0x40;
              perm_00.memFactor = (Real)&local_388;
              perm_00.thesize = auVar9._0_4_;
              perm_00.themax = auVar9._4_4_;
              perm_00.data = (int *)auVar9._8_8_;
              isLhsEqualRhs_00.data = (bool *)uVar35;
              isLhsEqualRhs_00.memFactor = (Real)this_01;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
                   in_stack_fffffffffffff924;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
                   in_stack_fffffffffffff920;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._0_4_ = in_stack_fffffffffffff928;
              tols.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_4_ = in_stack_fffffffffffff92c;
              DuplicateRowsPS::DuplicateRowsPS
                        (pDVar19,lp,iVar25,local_604,local_608,pDVar17 + uVar29,scale_00,perm_00,
                         isLhsEqualRhs_00,SUB81(__x_00,0),perm._0_1_,tols,
                         SUB41(in_stack_fffffffffffff930,0));
              std::
              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
              ::
              __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::DuplicateRowsPS,void>
                        ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                          *)&ptr,pDVar19);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_388._M_refcount);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_420 + 8));
              DataArray<bool>::~DataArray((DataArray<bool> *)local_368);
              DataArray<int>::~DataArray((DataArray<int> *)(local_368 + 0x18));
              std::
              _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ::~_Vector_base(&local_338);
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&this_00->data,(value_type *)&ptr);
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            DataArray<int>::~DataArray((DataArray<int> *)&factor);
            tVar10 = boost::multiprecision::operator>
                               (&compare.epsiloncompare,
                                (__x->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar25);
            if (!tVar10) {
              tVar10 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_5d8,
                                  (__x_00->val).
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + iVar25);
              bVar12 = true;
              if (!tVar10) goto LAB_0026967d;
            }
            local_278[1]._1_3_ = uStack_673;
            local_278._0_5_ = _local_678;
            auStack_280[1]._1_3_ = uStack_67b;
            auStack_280._0_5_ = stack0xfffffffffffff980;
            local_288[0] = local_688[0];
            local_288[1] = local_688[1];
            local_298 = (Tolerances *)local_698;
            p_Stack_290 = uStack_690;
            local_270 = local_670;
            local_26c = local_66c;
            local_268 = (fpclass_type)local_668;
            iStack_264 = local_668._4_4_;
            auStack_2d0[1] = in_stack_fffffffffffff924;
            auStack_2d0[0] = in_stack_fffffffffffff920;
            local_2c8[1] = in_stack_fffffffffffff92c;
            local_2c8[0] = in_stack_fffffffffffff928;
            auStack_2c0[1] = uStack_6cc;
            auStack_2c0[0] = in_stack_fffffffffffff930;
            local_2d8 = perm;
            local_2b8 = (uint  [2])uVar4;
            local_2b0 = local_6c0;
            local_2ac = local_6bc;
            local_2a8 = _local_6b8;
            feastol(&local_a0,this_01);
            bVar11 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_298,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_2d8,&local_a0);
            if (bVar11) {
              free(perm_tmp);
              perm_tmp = (int *)0x0;
              bVar11 = true;
              bVar12 = false;
            }
            else {
              tVar10 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_698,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&perm);
              if (tVar10) {
                uStack_690 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920);
                local_688[1] = in_stack_fffffffffffff92c;
                local_688[0] = in_stack_fffffffffffff928;
                stack0xfffffffffffff980 = (undefined5)CONCAT44(uStack_6cc,in_stack_fffffffffffff930)
                ;
                uStack_67b = (undefined3)((ulong)uVar8 >> 0x28);
                local_698 = (undefined1  [8])perm;
                _local_678 = _local_6c8;
                uStack_673 = uStack_6c3;
                local_670 = local_6c0;
                local_66c = local_6bc;
                local_668 = _local_6b8;
              }
              *(undefined8 *)
               (newLhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems + 8) =
                   uVar4;
              puVar1 = newLhsVec.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems + 4
              ;
              *(ulong *)puVar1 = CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928);
              *(ulong *)(puVar1 + 2) = CONCAT44(uStack_6cc,in_stack_fffffffffffff930);
              *(int **)newLhsVec.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems =
                   perm;
              *(ulong *)(newLhsVec.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems +
                        2) = CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920);
              newLhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.exp = local_6c0;
              newLhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.neg = local_6bc;
              newLhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.fpclass =
                   (fpclass_type)_local_6b8;
              newLhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.prec_elem =
                   SUB84(_local_6b8,4);
              *(ulong *)(newRhsVec.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems +
                        8) = CONCAT35(uStack_673,_local_678);
              puVar1 = newRhsVec.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems + 4
              ;
              *(undefined8 *)puVar1 = local_688._0_8_;
              *(ulong *)(puVar1 + 2) = CONCAT35(uStack_67b,stack0xfffffffffffff980);
              *(undefined1 (*) [8])
               newRhsVec.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems = local_698
              ;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               (newRhsVec.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.data._M_elems + 2) =
                   uStack_690;
              newRhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.exp = local_670;
              newRhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.neg = local_66c;
              newRhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.fpclass =
                   (fpclass_type)local_668;
              newRhsVec.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar25].m_backend.prec_elem =
                   local_668._4_4_;
              bVar12 = true;
              bVar11 = true;
            }
          }
LAB_0026967d:
          DataArray<bool>::~DataArray(&isLhsEqualRhs);
          if (!bVar12) goto LAB_002698be;
        }
      }
      if (bVar11) {
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x38])(lp,&newLhsVec,&newRhsVec,0);
        uVar32 = (ulong)(uint)(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
      }
      perm = (int *)0x0;
      spx_alloc<int*>(&perm,(int)uVar32);
      pIVar28 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      pDVar5 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey;
      uVar34 = 0;
      uVar16 = uVar32 & 0xffffffff;
      if ((int)uVar32 < 1) {
        uVar16 = uVar34;
      }
      iVar25 = 0;
      for (uVar30 = 0; iVar27 = (int)uVar34, uVar16 != uVar30; uVar30 = uVar30 + 1) {
        if (remRow.data[uVar30] == true) {
          perm[uVar30] = -1;
          remRows = iVar27 + 1;
          uVar34 = (ulong)(uint)remRows;
          iVar25 = iVar25 + pIVar28[pDVar5[uVar30].idx].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
        }
        else {
          perm[uVar30] = 0;
        }
      }
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x11])(lp,perm);
      piVar31 = (this_01->m_rIdx).data;
      for (uVar34 = 0; uVar16 != uVar34; uVar34 = uVar34 + 1) {
        if (-1 < (long)perm[uVar34]) {
          piVar31[perm[uVar34]] = piVar31[uVar34];
        }
      }
      free(perm);
      perm = (int *)0x0;
      free(perm_tmp);
      perm_tmp = (int *)0x0;
      if (iVar27 + iVar25 != 0 && SCARRY4(iVar27,iVar25) == iVar27 + iVar25 < 0) {
        piVar31 = &(this_01->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remRows;
        *piVar31 = *piVar31 + iVar27;
        piVar31 = &(this_01->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remNzos;
        *piVar31 = *piVar31 + iVar25;
        pSVar14 = (this_01->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).spxout;
        if ((pSVar14 != (SPxOut *)0x0) && (3 < (int)pSVar14->m_verbosity)) {
          compare.epsiloncompare.m_backend.data._M_elems[0] = pSVar14->m_verbosity;
          local_5d8._0_4_ = 4;
          (*pSVar14->_vptr_SPxOut[2])();
          pSVar14 = soplex::operator<<((this_01->
                                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).spxout,"Simplifier (duplicate rows) removed ");
          pSVar14 = soplex::operator<<(pSVar14,iVar27);
          pSVar14 = soplex::operator<<(pSVar14," rows, ");
          pSVar14 = soplex::operator<<(pSVar14,iVar25);
          pSVar14 = soplex::operator<<(pSVar14," non-zeros");
          std::endl<char,std::char_traits<char>>(pSVar14->m_streams[pSVar14->m_verbosity]);
          pSVar14 = (this_01->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).spxout;
          (*pSVar14->_vptr_SPxOut[2])(pSVar14,&compare);
        }
        compare.epsiloncompare.m_backend.fpclass = cpp_dec_float_finite;
        compare.epsiloncompare.m_backend.prec_elem = 10;
        compare.epsiloncompare.m_backend.data._M_elems[0] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[1] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[2] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[3] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[4] = 0;
        compare.epsiloncompare.m_backend.data._M_elems[5] = 0;
        compare.epsiloncompare.m_backend.data._M_elems._24_5_ = 0;
        compare.epsiloncompare.m_backend.data._M_elems[7]._1_3_ = 0;
        compare.epsiloncompare.m_backend.data._M_elems._32_5_ = 0;
        compare.epsiloncompare.m_backend.data._M_elems[9]._1_3_ = 0;
        compare.epsiloncompare.m_backend.exp = 0;
        compare.epsiloncompare.m_backend.neg = false;
        local_5d8 = (undefined1  [8])(long)iVar2;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  ((cpp_dec_float<50U,_int,_void> *)&compare,
                   &(this_01->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).m_minReduction.m_backend,(longlong *)local_5d8);
        tVar10 = boost::multiprecision::operator>(&remRows,&compare.epsiloncompare);
        if (tVar10) {
          *again = true;
        }
      }
      local_5e0 = OKAY;
LAB_002698be:
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&newRhsVec);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&newLhsVec);
      DataArray<bool>::~DataArray(&remRow);
      IdxSet::~IdxSet(&idxSet);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&scale);
      DataArray<int>::~DataArray(&classSize);
      DataArray<int>::~DataArray(&pClass);
    }
  }
  return local_5e0;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::duplicateRows(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies the LP by removing duplicate rows
   // Duplicates are detected using the algorithm of Bixby and Wagner [1987]

   // Possible extension: use generalized definition of duplicate rows according to Andersen and Andersen
   // However: the resulting sparsification is often very small since the involved rows are usually very sparse

   int remRows = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();

   // remove empty rows and columns
   typename SPxSimplifier<R>::Result ret = removeEmpty(lp);

   if(ret != this->OKAY)
      return ret;

#if SOPLEX_ROW_SINGLETON
   int rs_remRows = 0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);

      if(row.size() == 1)
      {
         removeRowSingleton(lp, row, i);
         rs_remRows++;
      }
   }

   if(rs_remRows > 0)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) <<
                    "Simplifier duplicate rows (row singleton stage) removed "
                    << rs_remRows << " rows, "
                    << rs_remRows << " non-zeros"
                    << std::endl;)
   }

#endif

   if(lp.nRows() < 2)
      return this->OKAY;

   DataArray<int>    pClass(lp.nRows());           // class of parallel rows
   DataArray<int>    classSize(lp.nRows());        // size of each class
   Array<R>   scale(lp.nRows());            // scaling factor for each row
   int*              idxMem = nullptr;

   try
   {
      spx_alloc(idxMem, lp.nRows());
   }
   catch(const SPxMemoryException& x)
   {
      spx_free(idxMem);
      throw x;
   }

   IdxSet idxSet(lp.nRows(), idxMem);           // set of feasible indices for new pClass

   // init
   pClass[0]    = 0;
   scale[0]     = 0.0;
   classSize[0] = lp.nRows();

   for(int i = 1; i < lp.nRows(); ++i)
   {
      pClass[i] = 0;
      scale[i]  = 0.0;
      classSize[i] = 0;
      idxSet.addIdx(i);
   }

   R oldVal = 0.0;

   // main loop
   for(int j = 0; j < lp.nCols(); ++j)
   {
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);
         int  i   = col.index(k);

         if(scale[i] == 0.0)
            scale[i] = aij;

         m_classSetRows[pClass[i]].add(i, aij / scale[i]);

         if(--classSize[pClass[i]] == 0)
            idxSet.addIdx(pClass[i]);
      }

      // update each parallel class with non-zero column entry
      for(int m = 0; m < col.size(); ++m)
      {
         int k = pClass[col.index(m)];

         if(m_classSetRows[k].size() > 0)
         {
            // sort classSet[k] w.r.t. scaled column values
            ElementCompare compare(this->tolerances()->epsilon());

            if(m_classSetRows[k].size() > 1)
            {
               // nonzeros should not contain nan or inf values
               assert(!m_classSetRows[k].hasNaNs());
               assert(!m_classSetRows[k].hasInfs());
               SPxQuicksort(m_classSetRows[k].mem(), m_classSetRows[k].size(), compare);
            }

            // use new index first
            int classIdx = idxSet.index(0);
            idxSet.remove(0);

            for(int l = 0; l < m_classSetRows[k].size(); ++l)
            {
               if(l != 0 && NErel(m_classSetRows[k].value(l), oldVal, this->epsZero()))
               {
                  classIdx = idxSet.index(0);
                  idxSet.remove(0);
               }

               pClass[m_classSetRows[k].index(l)] = classIdx;
               ++classSize[classIdx];

               oldVal = m_classSetRows[k].value(l);
            }

            m_classSetRows[k].clear();
         }
      }
   }

   spx_free(idxMem);

   DataArray<bool> remRow(lp.nRows());

   for(int k = 0; k < lp.nRows(); ++k)
      m_dupRows[k].clear();

   for(int k = 0; k < lp.nRows(); ++k)
   {
      remRow[k] = false;
      m_dupRows[pClass[k]].add(k, 0.0);
   }

   const int nRowsOld_tmp = lp.nRows();
   int* perm_tmp = nullptr;
   spx_alloc(perm_tmp, nRowsOld_tmp);

   for(int j = 0; j < nRowsOld_tmp; ++j)
   {
      perm_tmp[j] = 0;
   }

   int idxFirstDupRows = -1;
   int idxLastDupRows = -1;
   int numDelRows = 0;

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         idxLastDupRows = k;

         if(idxFirstDupRows < 0)
         {
            idxFirstDupRows = k;
         }

         for(int l = 1; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            perm_tmp[i] = -1;
         }

         numDelRows += (m_dupRows[k].size() - 1);
      }
   }

   {
      int k_tmp, j_tmp = -1;

      for(k_tmp = j_tmp = 0; k_tmp < nRowsOld_tmp; ++k_tmp)
      {
         if(perm_tmp[k_tmp] >= 0)
            perm_tmp[k_tmp] = j_tmp++;
      }
   }

   // store rhs and lhs changes for combined update
   bool doChangeRanges = false;
   VectorBase<R> newLhsVec(lp.lhs());
   VectorBase<R> newRhsVec(lp.rhs());

   for(int k = 0; k < lp.nRows(); ++k)
   {
      if(m_dupRows[k].size() > 1 && !(lp.rowVector(m_dupRows[k].index(0)).size() == 1))
      {
         SPxOut::debug(this, "IMAISM53 {} duplicate rows found\n", m_dupRows[k].size());

         m_stat[DUPLICATE_ROW] += m_dupRows[k].size() - 1;

         // index of one non-column singleton row in dupRows[k]
         int  rowIdx    = -1;
         int  maxLhsIdx = -1;
         int  minRhsIdx = -1;
         R maxLhs    = R(-infinity);
         R minRhs    = +R(infinity);

         DataArray<bool> isLhsEqualRhs(m_dupRows[k].size());

         // determine strictest bounds on constraint
         for(int l = 0; l < m_dupRows[k].size(); ++l)
         {
            int i = m_dupRows[k].index(l);
            isLhsEqualRhs[l] = (lp.lhs(i) == lp.rhs(i));

            SOPLEX_ASSERT_WARN("WMAISM54", isNotZero(scale[i], R(1.0 / R(infinity))));

            if(rowIdx == -1)
            {
               rowIdx = i;
               maxLhs = lp.lhs(rowIdx);
               minRhs = lp.rhs(rowIdx);
            }
            else
            {
               R scaledLhs, scaledRhs;
               R factor = scale[rowIdx] / scale[i];

               if(factor > 0)
               {
                  scaledLhs = (lp.lhs(i) <= R(-infinity)) ? R(-infinity) : lp.lhs(i) * factor;
                  scaledRhs = (lp.rhs(i) >=  R(infinity)) ?  R(infinity) : lp.rhs(i) * factor;
               }
               else
               {
                  scaledLhs = (lp.rhs(i) >=  R(infinity)) ? R(-infinity) : lp.rhs(i) * factor;
                  scaledRhs = (lp.lhs(i) <= R(-infinity)) ?  R(infinity) : lp.lhs(i) * factor;
               }

               if(scaledLhs > maxLhs)
               {
                  maxLhs    = scaledLhs;
                  maxLhsIdx = i;
               }

               if(scaledRhs < minRhs)
               {
                  minRhs    = scaledRhs;
                  minRhsIdx = i;
               }

               remRow[i] = true;
            }
         }

         if(rowIdx != -1)
         {
            R newLhs = (maxLhs > lp.lhs(rowIdx)) ? maxLhs : lp.lhs(rowIdx);
            R newRhs = (minRhs < lp.rhs(rowIdx)) ? minRhs : lp.rhs(rowIdx);

            if(k == idxLastDupRows)
            {
               DataArray<int> da_perm(nRowsOld_tmp);

               for(int j = 0; j < nRowsOld_tmp; ++j)
               {
                  da_perm[j] = perm_tmp[j];
               }

               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm, isLhsEqualRhs, true,
                                             EQrel(newLhs, newRhs, this->tolerances()->epsilon()), this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }
            else
            {
               DataArray<int> da_perm_empty(0);
               std::shared_ptr<PostStep> ptr(new DuplicateRowsPS(lp, rowIdx, maxLhsIdx, minRhsIdx,
                                             m_dupRows[k], scale, da_perm_empty, isLhsEqualRhs, false, EQrel(newLhs, newRhs,
                                                   this->tolerances()->epsilon()),
                                             this->_tolerances, k == idxFirstDupRows));
               m_hist.append(ptr);
            }

            if(maxLhs > lp.lhs(rowIdx) || minRhs < lp.rhs(rowIdx))
            {
               // modify lhs and rhs of constraint rowIdx
               doChangeRanges = true;

               if(LTrel(newRhs, newLhs, feastol()))
               {
                  SPxOut::debug(this, "IMAISM55 duplicate rows yield infeasible bounds: lhs={} rhs={}\n", newLhs,
                                newRhs);
                  spx_free(perm_tmp);
                  return this->INFEASIBLE;
               }

               // if we accept the infeasibility we should clean up the values to avoid problems later
               if(newRhs < newLhs)
                  newRhs = newLhs;

               newLhsVec[rowIdx] = newLhs;
               newRhsVec[rowIdx] = newRhs;
            }
         }
      }
   }

   // change ranges for all modified constraints by one single call (more efficient)
   if(doChangeRanges)
   {
      lp.changeRange(newLhsVec, newRhsVec);
   }

   // remove all rows by one single method call (more efficient)
   const int nRowsOld = lp.nRows();
   int* perm = nullptr;
   spx_alloc(perm, nRowsOld);

   for(int i = 0; i < nRowsOld; ++i)
   {
      if(remRow[i])
      {
         perm[i] = -1;
         ++remRows;
         remNzos += lp.rowVector(i).size();
      }
      else
         perm[i] = 0;
   }

   lp.removeRows(perm);

   for(int i = 0; i < nRowsOld; ++i)
   {
      // assert that the pre-computed permutation was correct
      assert(perm[i] == perm_tmp[i]);

      // update the global index mapping
      if(perm[i] >= 0)
         m_rIdx[perm[i]] = m_rIdx[i];
   }

   spx_free(perm);
   spx_free(perm_tmp);

   if(remRows + remNzos > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (duplicate rows) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remRows > this->m_minReduction * oldRows)
         again = true;

   }

   return this->OKAY;
}